

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::CommissionerApp::GetPanId
          (Error *__return_storage_ptr__,CommissionerApp *this,uint16_t *aPanId)

{
  char cVar1;
  ErrorCode EVar2;
  element_type *peVar3;
  int iVar4;
  Error *pEVar5;
  char *pcVar6;
  char *pcVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  undefined1 local_b8 [8];
  _Alloc_hider local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  parse_func local_90 [1];
  string local_80;
  writer write;
  undefined1 local_58 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  iVar4 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])(this);
  if ((char)iVar4 == '\0') {
    local_b8._0_4_ = none_type;
    local_b0._M_p = "the commissioner is not active";
    local_a8 = 0x1e;
    local_a0._M_allocated_capacity = 0;
    local_90[0] = (parse_func)0x0;
    pcVar6 = "the commissioner is not active";
    local_a0._8_8_ = local_b8;
    while (pcVar7 = pcVar6, pcVar7 != "") {
      pcVar6 = pcVar7 + 1;
      if (*pcVar7 == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = pcVar7 + 2;
      }
      else if (*pcVar7 == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar7,"",(format_string_checker<char> *)local_b8);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_b8;
    ::fmt::v10::vformat_abi_cxx11_(&local_80,(v10 *)0x1f85d8,(string_view)ZEXT816(0x1e),args);
    local_58._0_4_ = kInvalidState;
    std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_80);
  }
  else {
    peVar3 = (this->mCommissioner).
             super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar3->_vptr_Commissioner[0x1a])(local_b8,peVar3,&this->mActiveDataset);
    pEVar5 = Error::operator=(__return_storage_ptr__,(Error *)local_b8);
    EVar2 = pEVar5->mCode;
    std::__cxx11::string::~string((string *)&local_b0);
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    if (((this->mActiveDataset).mPresentFlags & 0x100) != 0) {
      *aPanId = (this->mActiveDataset).mPanId;
      return __return_storage_ptr__;
    }
    local_b8._0_4_ = none_type;
    local_b0._M_p = "cannot find valid PAN ID in Active Operational Dataset";
    local_a8 = 0x36;
    local_a0._M_allocated_capacity = 0;
    local_90[0] = (parse_func)0x0;
    pcVar6 = "cannot find valid PAN ID in Active Operational Dataset";
    local_a0._8_8_ = local_b8;
    write.handler_ = (format_string_checker<char> *)local_b8;
    while (pcVar6 != "") {
      cVar1 = *pcVar6;
      pcVar7 = pcVar6;
      while (cVar1 != '{') {
        pcVar7 = pcVar7 + 1;
        if (pcVar7 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,pcVar6,"");
          goto LAB_0014b9ad;
        }
        cVar1 = *pcVar7;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,pcVar6,pcVar7);
      pcVar6 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar7,"",(format_string_checker<char> *)local_b8);
    }
LAB_0014b9ad:
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_b8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_80,(v10 *)"cannot find valid PAN ID in Active Operational Dataset",
               (string_view)ZEXT816(0x36),args_00);
    local_58._0_4_ = kNotFound;
    std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_80);
  }
  Error::operator=(__return_storage_ptr__,(Error *)local_58);
  std::__cxx11::string::~string((string *)(local_58 + 8));
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::GetPanId(uint16_t &aPanId)
{
    Error error;

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    SuccessOrExit(error = mCommissioner->GetActiveDataset(mActiveDataset, 0xFFFF));

    VerifyOrExit(mActiveDataset.mPresentFlags & ActiveOperationalDataset::kPanIdBit,
                 error = ERROR_NOT_FOUND("cannot find valid PAN ID in Active Operational Dataset"));
    aPanId = mActiveDataset.mPanId;

exit:
    return error;
}